

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

void __thiscall ON_SubDMeshImpl::SealEdges(ON_SubDMeshImpl *this)

{
  ON_SubDLimitMeshSealEdgeInfo *pOVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  uint grid_side_dex;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list;
  ON_SubDLimitMeshSealEdgeInfo local_48;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> local_38;
  
  local_38._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008291b8;
  local_38.m_a = (ON_SubDLimitMeshSealEdgeInfo *)0x0;
  local_38.m_count = 0;
  local_38.m_capacity = 0;
  if ((ulong)this->m_fragment_count != 0) {
    ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::SetCapacity
              (&local_38,(ulong)this->m_fragment_count);
  }
  local_48.m_edge_id = 0;
  local_48.m_bits = '\0';
  local_48.m_grid_side_dex = '\0';
  local_48.m_face_edge_count = 0;
  local_48.m_fragment = this->m_first_fragment;
  if (local_48.m_fragment != (ON_SubDMeshFragment *)0x0) {
    do {
      if ((local_48.m_fragment)->m_face != (ON_SubDFace *)0x0) {
        uVar5 = 0;
        do {
          bVar4 = ON_SubDLimitMeshSealEdgeInfo::SetEdge(&local_48,uVar5);
          if (bVar4) {
            ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::Append(&local_38,&local_48);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 4);
      }
      local_48.m_fragment = (local_48.m_fragment)->m_next_fragment;
    } while (local_48.m_fragment != (ON_SubDMeshFragment *)0x0);
  }
  if ((local_38.m_a != (ON_SubDLimitMeshSealEdgeInfo *)0x0) && (1 < (long)local_38.m_count)) {
    ON_qsort(local_38.m_a,(long)local_38.m_count,0x10,
             ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
  }
  iVar3 = local_38.m_count;
  if (local_38.m_count != 0) {
    uVar6 = 0;
    do {
      uVar5 = (uint)uVar6;
      pOVar1 = local_38.m_a + uVar6;
      local_48.m_edge_id = pOVar1->m_edge_id;
      local_48.m_bits = pOVar1->m_bits;
      local_48.m_grid_side_dex = pOVar1->m_grid_side_dex;
      local_48.m_face_edge_count = pOVar1->m_face_edge_count;
      local_48.m_fragment = pOVar1->m_fragment;
      uVar2 = local_48._0_8_ & 0xc000000000;
      bVar7 = local_48.m_bits & 0xc0;
      while( true ) {
        uVar5 = uVar5 + 1;
        uVar6 = (ulong)uVar5;
        if ((uint)iVar3 <= uVar5) break;
        if ((local_48.m_edge_id != local_38.m_a[uVar6].m_edge_id) ||
           ((uVar2 != 0 && ((local_38.m_a[uVar6].m_bits & bVar7) == 0)))) break;
        ON_SubDLimitMeshSealEdgeInfo::Seal(&local_48,local_38.m_a + uVar6);
      }
    } while (uVar5 < (uint)iVar3);
  }
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::~ON_SimpleArray(&local_38);
  return;
}

Assistant:

void ON_SubDMeshImpl::SealEdges()
{
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list(m_fragment_count);
  ON_SubDLimitMeshSealEdgeInfo fe;
  for (fe.m_fragment = m_first_fragment; nullptr != fe.m_fragment; fe.m_fragment = fe.m_fragment->m_next_fragment)
  {
    if (nullptr == fe.m_fragment->m_face)
      continue;
    for (unsigned int grid_side_dex = 0; grid_side_dex < 4; grid_side_dex++)
    {
      if ( fe.SetEdge(grid_side_dex) )
        fe_list.Append(fe);
    }
  }

  fe_list.QuickSort(ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
  const unsigned int fe_list_count = fe_list.UnsignedCount();
  unsigned int i0 = 0;
  while ( i0 < fe_list_count )
  {
    fe = fe_list[i0];
    const unsigned char src_half_mask = (fe.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
    for ( i0++; i0 < fe_list_count && fe.m_edge_id == fe_list[i0].m_edge_id; i0++ )
    {
      if (0 != src_half_mask && 0 == (src_half_mask & fe_list[i0].m_bits))
        break; // necessary when all faces attached to an edge are not quads.
      ON_SubDLimitMeshSealEdgeInfo::Seal(fe, fe_list[i0]);
    }
  }
}